

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O0

void car25519(int64_t *o)

{
  long lVar1;
  long lVar2;
  ulong local_20;
  size_t i;
  int64_t c;
  int64_t *o_local;
  
  for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
    o[local_20] = o[local_20] + 0x10000;
    lVar1 = o[local_20] >> 0x10;
    lVar2 = (local_20 + 1) * (long)(int)(uint)(local_20 < 0xf);
    o[lVar2] = lVar1 + -1 + (lVar1 + -1) * 0x25 * (long)(int)(uint)(local_20 == 0xf) + o[lVar2];
    o[local_20] = o[local_20] + lVar1 * -0x10000;
  }
  return;
}

Assistant:

static void car25519(gf o)
{
  int64_t c;
  size_t i;

  for (i = 0; i < 16; i++)
  {
    o[i] += (1LL << 16);
    c = o[i] >> 16;
    o[(i + 1) * (i < 15)] += c - 1 + 37 * (c - 1) * (i == 15);
    o[i] -= c << 16;
  }
}